

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O2

FConfigFile * __thiscall FConfigFile::operator=(FConfigFile *this,FConfigFile *other)

{
  FConfigSection *pFVar1;
  FConfigSection *section;
  FConfigFile *this_00;
  FConfigEntry *pFVar2;
  FConfigSection **ppFVar3;
  
  ClearConfig(this);
  ppFVar3 = &other->Sections;
  while (pFVar1 = *ppFVar3, pFVar1 != (FConfigSection *)0x0) {
    pFVar2 = pFVar1->RootEntry;
    this_00 = this;
    section = NewConfigSection(this,(pFVar1->SectionName).Chars);
    for (; pFVar2 != (FConfigEntry *)0x0; pFVar2 = pFVar2->Next) {
      NewConfigEntry(this_00,section,pFVar2->Key,pFVar2->Value);
    }
    ppFVar3 = &pFVar1->Next;
  }
  return this;
}

Assistant:

FConfigFile &FConfigFile::operator = (const FConfigFile &other)
{
	FConfigSection *fromsection, *tosection;
	FConfigEntry *fromentry;

	ClearConfig ();
	fromsection = other.Sections;
	while (fromsection != NULL)
	{
		fromentry = fromsection->RootEntry;
		tosection = NewConfigSection (fromsection->SectionName);
		while (fromentry != NULL)
		{
			NewConfigEntry (tosection, fromentry->Key, fromentry->Value);
			fromentry = fromentry->Next;
		}
		fromsection = fromsection->Next;
	}
	return *this;
}